

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.h
# Opt level: O0

void __thiscall
ResourceDeleter<const_AmsNetId>::operator()
          (ResourceDeleter<const_AmsNetId> *this,AmsNetId *resource)

{
  AmsNetId *resource_local;
  ResourceDeleter<const_AmsNetId> *this_local;
  
  std::function<long_(AmsNetId)>::operator()(&this->FreeResource,*(AmsNetId *)resource->b);
  if (resource != (AmsNetId *)0x0) {
    operator_delete(resource);
  }
  return;
}

Assistant:

void operator()(T* resource) noexcept
    {
        FreeResource(*resource);
        delete resource;
    }